

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_private.c
# Opt level: O3

zt_log_ty * zt_log_new(zt_log_vtbl_ty *vptr,uint opts)

{
  int iVar1;
  uint uVar2;
  zt_log_ty *pzVar3;
  size_t sVar4;
  tm *__tp;
  char *pcVar5;
  size_t sVar6;
  char *pcVar7;
  uint in_ECX;
  char *__s;
  uint unaff_EBX;
  char *in_R8;
  uint in_R9D;
  size_t num;
  time_t tStack_158;
  char acStack_150 [264];
  ulong uStack_48;
  
  pcVar7 = (char *)vptr->size;
  pzVar3 = (zt_log_ty *)zt_calloc_p(1,(size_t)pcVar7);
  if (pzVar3 != (zt_log_ty *)0x0) {
    pzVar3->vtbl = vptr;
    pzVar3->opts = opts;
    pzVar3->level = zt_log_max;
    return pzVar3;
  }
  zt_log_new_cold_1();
  uStack_48 = (ulong)opts;
  sVar4 = strlen(pcVar7);
  num = sVar4 + 4;
  pzVar3 = (zt_log_ty *)zt_calloc_p(num,1);
  if ((unaff_EBX & 1) != 0) {
    tStack_158 = time((time_t *)0x0);
    __tp = localtime(&tStack_158);
    sVar4 = strftime(acStack_150,0xfe,"%b %d %H:%M:%S ",__tp);
    num = num + sVar4;
    pzVar3 = (zt_log_ty *)zt_realloc_p(pzVar3,num);
    strcpy((char *)pzVar3,acStack_150);
  }
  if ((unaff_EBX & 4) != 0) {
    iVar1 = gethostname(acStack_150,0xfe);
    if (iVar1 == -1) {
      builtin_strncpy(acStack_150,"*hostname*",0xb);
    }
    pcVar5 = strchr(acStack_150,0x2e);
    if (pcVar5 != (char *)0x0) {
      *pcVar5 = '\0';
    }
    sVar4 = strlen(acStack_150);
    num = num + sVar4 + 1;
    pzVar3 = (zt_log_ty *)zt_realloc_p(pzVar3,num);
    strcat((char *)pzVar3,acStack_150);
    if (4 < unaff_EBX) {
      sVar4 = strlen((char *)pzVar3);
      pcVar5 = (char *)((long)&pzVar3->vtbl + sVar4);
      pcVar5[0] = ' ';
      pcVar5[1] = '\0';
    }
  }
  if ((unaff_EBX & 8) != 0) {
    pcVar5 = zt_progname((char *)0x0,0);
    sVar4 = strlen(pcVar5);
    num = num + sVar4;
    pzVar3 = (zt_log_ty *)zt_realloc_p(pzVar3,num);
    pcVar5 = zt_progname((char *)0x0,0);
    strcat((char *)pzVar3,pcVar5);
  }
  if ((unaff_EBX & 0x10) != 0) {
    uVar2 = getpid();
    sprintf(acStack_150,"[%u]",(ulong)uVar2);
    sVar4 = strlen(acStack_150);
    num = num + sVar4;
    pzVar3 = (zt_log_ty *)zt_realloc_p(pzVar3,num);
    strcat((char *)pzVar3,acStack_150);
  }
  if (in_R9D < 8 && (unaff_EBX & 2) != 0) {
    sVar4 = strlen(zt_log_level_desc[in_R9D].desc);
    num = num + sVar4 + 2;
    pzVar3 = (zt_log_ty *)zt_realloc_p(pzVar3,num);
    if (unaff_EBX != 2) {
      sVar4 = strlen((char *)pzVar3);
      pcVar5 = (char *)((long)&pzVar3->vtbl + sVar4);
      pcVar5[0] = ':';
      pcVar5[1] = ' ';
      *(char *)((long)&pzVar3->vtbl + sVar4 + 2) = '\0';
    }
    strcat((char *)pzVar3,zt_log_level_desc[in_R9D].desc);
  }
  else if (unaff_EBX == 0) goto LAB_0012703f;
  sVar4 = strlen((char *)pzVar3);
  *(undefined2 *)((long)&pzVar3->vtbl + sVar4) = 0x203a;
  *(undefined1 *)((long)&pzVar3->vtbl + sVar4 + 2) = 0;
LAB_0012703f:
  strcat((char *)pzVar3,pcVar7);
  if ((in_R8 != (char *)0x0 && __s != (char *)0x0) && -1 < (int)in_ECX) {
    sVar4 = strlen(__s);
    sVar6 = strlen(in_R8);
    pcVar7 = (char *)zt_calloc_p(sVar4 + sVar6 + 0x17,1);
    sprintf(pcVar7,": in %s at (%s:%d)",in_R8,__s,(ulong)in_ECX);
    pzVar3 = (zt_log_ty *)zt_realloc_p(pzVar3,sVar4 + sVar6 + num + 0x17);
    strcat((char *)pzVar3,pcVar7);
    if (pcVar7 != (char *)0x0) {
      free(pcVar7);
    }
  }
  sVar4 = strlen((char *)pzVar3);
  *(undefined2 *)((long)&pzVar3->vtbl + sVar4) = 10;
  return pzVar3;
}

Assistant:

zt_log_ty *
zt_log_new(zt_log_vtbl_ty * vptr, unsigned int opts) {
    zt_log_ty * result;

    result        = zt_callocs(vptr->size, 1);
    if (!result) {
        fprintf(stderr, "Unable to calloc memory for log vtable\n");
        exit(1);
    }
    result->vtbl  = vptr;
    result->opts  = opts;
    result->level = zt_log_max;

    return result;
}